

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# access.cc
# Opt level: O2

process_id_t __thiscall
tchecker::variable_access_map_t::accessing_process
          (variable_access_map_t *this,variable_id_t vid,variable_type_t vtype,
          variable_access_t vaccess)

{
  reference puVar1;
  invalid_argument *this_00;
  range_t<boost::container::vec_iterator<unsigned_int_*,_true>,_boost::container::vec_iterator<unsigned_int_*,_true>_>
  range;
  
  accessing_processes((variable_access_map_t *)&range,(variable_id_t)this,vid,vtype);
  if (range._end.m_ptr == range._begin.m_ptr) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"Unknown variable");
  }
  else {
    if ((long)range._end.m_ptr - (long)range._begin.m_ptr < 5) {
      puVar1 = boost::container::vec_iterator<unsigned_int_*,_true>::operator*(&range._begin);
      return *puVar1;
    }
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"Shared variable");
  }
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

process_id_t variable_access_map_t::accessing_process(tchecker::variable_id_t vid, enum tchecker::variable_type_t vtype,
                                                      enum tchecker::variable_access_t vaccess) const
{
  auto range = accessing_processes(vid, vtype, vaccess);
  auto d = std::distance(range.begin(), range.end());
  if (d == 0)
    throw std::invalid_argument("Unknown variable");
  if (d > 1)
    throw std::invalid_argument("Shared variable");
  return *range.begin();
}